

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int WriteOptionPick(TidyOptionImpl *option,uint ival,StreamOut *out)

{
  ctmbstr sval;
  int iVar1;
  PickListItem *pPVar2;
  ulong uVar3;
  ulong uVar4;
  
  pPVar2 = *option->pickList;
  iVar1 = -1;
  if (pPVar2 != (PickListItem *)0x0) {
    uVar3 = 0;
    do {
      sval = ((PickListItem *)&pPVar2->label)->label;
      uVar4 = uVar3 + 1;
      if (ival <= uVar3) break;
      pPVar2 = pPVar2 + 1;
      uVar3 = uVar4;
    } while (sval != (ctmbstr)0x0);
    iVar1 = -1;
    if (sval != (ctmbstr)0x0 && ival + 1 == (int)uVar4) {
      WriteOptionString(option,sval,out);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int  WriteOptionPick( const TidyOptionImpl* option, uint ival, StreamOut* out )
{
    uint ix = 0;
    const PickListItem *item = NULL;
    
    if ( option-> pickList )
    {
        while ( (item = &(*option->pickList)[ ix ]) && item->label && ix<ival )
        {
            ++ix;
        }
        if ( ix==ival && item->label )
            return WriteOptionString( option, item->label, out );
    }
    
    return -1;
}